

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedobject.cpp
# Opt level: O0

void __thiscall icu_63::SharedObject::removeRef(SharedObject *this)

{
  UnifiedCacheBase *pUVar1;
  int32_t iVar2;
  int32_t updatedRefCount;
  UnifiedCacheBase *cache;
  SharedObject *this_local;
  
  pUVar1 = this->cachePtr;
  iVar2 = umtx_atomic_dec(&this->hardRefCount);
  if (iVar2 == 0) {
    if (pUVar1 == (UnifiedCacheBase *)0x0) {
      if (this != (SharedObject *)0x0) {
        (*(this->super_UObject)._vptr_UObject[1])();
      }
    }
    else {
      (*(pUVar1->super_UObject)._vptr_UObject[3])();
    }
  }
  return;
}

Assistant:

void
SharedObject::removeRef() const {
    const UnifiedCacheBase *cache = this->cachePtr;
    int32_t updatedRefCount = umtx_atomic_dec(&hardRefCount);
    U_ASSERT(updatedRefCount >= 0);
    if (updatedRefCount == 0) {
        if (cache) {
            cache->handleUnreferencedObject();
        } else {
            delete this;
        }
    }
}